

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O0

bool deqp::gls::anon_unknown_1::hasAttributeAliasing
               (vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
                *attributes,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               *bindings)

{
  int iVar1;
  _Bit_pointer bindings_00;
  bool bVar2;
  deUint32 dVar3;
  size_type sVar4;
  const_reference pvVar5;
  string *attrib;
  reference rVar6;
  reference local_b8;
  undefined4 local_a4;
  reference local_a0;
  int local_8c;
  undefined1 local_88 [4];
  int i;
  deUint32 local_60;
  deUint32 size;
  deInt32 local_50;
  int local_4c;
  deInt32 location;
  int attribNdx;
  vector<bool,_std::allocator<bool>_> reservedSpaces;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *bindings_local;
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  *attributes_local;
  
  reservedSpaces.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)bindings;
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)&location)
  ;
  local_4c = 0;
  do {
    iVar1 = local_4c;
    sVar4 = std::
            vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
            ::size(attributes);
    bindings_00 = reservedSpaces.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage;
    if ((int)sVar4 <= iVar1) {
      attributes_local._7_1_ = false;
LAB_026fdea1:
      local_a4 = 1;
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)&location);
      return attributes_local._7_1_;
    }
    pvVar5 = std::
             vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
             ::operator[](attributes,(long)local_4c);
    attrib = AttributeLocationTestUtil::Attribute::getName_abi_cxx11_(pvVar5);
    local_50 = getBoundLocation((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                 *)bindings_00,attrib);
    pvVar5 = std::
             vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
             ::operator[](attributes,(long)local_4c);
    AttributeLocationTestUtil::Attribute::getType((AttribType *)local_88,pvVar5);
    dVar3 = AttributeLocationTestUtil::AttribType::getLocationSize((AttribType *)local_88);
    AttributeLocationTestUtil::AttribType::~AttribType((AttribType *)local_88);
    local_60 = dVar3;
    if (local_50 != -1) {
      sVar4 = std::vector<bool,_std::allocator<bool>_>::size
                        ((vector<bool,_std::allocator<bool>_> *)&location);
      if (sVar4 < local_50 + local_60) {
        std::vector<bool,_std::allocator<bool>_>::resize
                  ((vector<bool,_std::allocator<bool>_> *)&location,(ulong)(local_50 + local_60),
                   false);
      }
      for (local_8c = 0; local_8c < (int)local_60; local_8c = local_8c + 1) {
        rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)&location,
                           (long)(local_50 + local_8c));
        local_a0 = rVar6;
        bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_a0);
        if (bVar2) {
          attributes_local._7_1_ = true;
          goto LAB_026fdea1;
        }
        rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)&location,
                           (long)(local_50 + local_8c));
        local_b8 = rVar6;
        std::_Bit_reference::operator=(&local_b8,true);
      }
    }
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

bool hasAttributeAliasing (const vector<Attribute>& attributes, const map<string, deUint32>& bindings)
{
	vector<bool> reservedSpaces;

	for (int attribNdx = 0; attribNdx < (int)attributes.size(); attribNdx++)
	{
		const deInt32	location	= getBoundLocation(bindings, attributes[attribNdx].getName());
		const deUint32	size		= attributes[attribNdx].getType().getLocationSize();

		if (location != Attribute::LOC_UNDEF)
		{
			if (reservedSpaces.size() < location + size)
				reservedSpaces.resize(location + size, false);

			for (int i = 0; i < (int)size; i++)
			{
				if (reservedSpaces[location + i])
					return true;

				reservedSpaces[location + i] = true;
			}
		}
	}

	return false;
}